

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::GPUShaderFP64Test2::getAmountUniforms
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type)

{
  GLuint GVar1;
  GLuint GVar2;
  uint local_44;
  GLuint max_uniforms;
  GLuint uniform_type_member_size;
  GLuint max_uniform_block_size;
  GLuint n_uniforms;
  GLuint required_components;
  GLuint max_uniform_components;
  uniformTypeDetails *uniform_type_local;
  shaderStage shader_stage_local;
  GPUShaderFP64Test2 *this_local;
  
  GVar1 = getMaxUniformComponents(this,shader_stage);
  GVar2 = getRequiredComponentsNumber(this,uniform_type);
  local_44 = GVar1 / GVar2;
  GVar1 = getMaxUniformBlockSize(this);
  GVar2 = getUniformTypeMemberSize(this,uniform_type);
  if (GVar1 / GVar2 < local_44) {
    local_44 = GVar1 / GVar2;
  }
  return local_44;
}

Assistant:

glw::GLuint GPUShaderFP64Test2::getAmountUniforms(shaderStage				shader_stage,
												  const uniformTypeDetails& uniform_type) const
{
	const glw::GLuint max_uniform_components   = getMaxUniformComponents(shader_stage);
	const glw::GLuint required_components	  = getRequiredComponentsNumber(uniform_type);
	const glw::GLuint n_uniforms			   = max_uniform_components / required_components;
	const glw::GLuint max_uniform_block_size   = getMaxUniformBlockSize();
	const glw::GLuint uniform_type_member_size = getUniformTypeMemberSize(uniform_type);
	const glw::GLuint max_uniforms			   = max_uniform_block_size / uniform_type_member_size;

	return max_uniforms < n_uniforms ? max_uniforms : n_uniforms;
}